

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_2> *
tcu::operator*(Matrix<float,_4,_2> *__return_storage_ptr__,Matrix<float,_4,_2> *mtx,float scalar)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vector<float,_4> *pVVar4;
  Matrix<float,_4,_2> *res;
  
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 1.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 1.0;
  pVVar4 = (__return_storage_ptr__->m_data).m_data;
  pVVar4[1].m_data[2] = 0.0;
  pVVar4[1].m_data[3] = 0.0;
  fVar1 = (mtx->m_data).m_data[0].m_data[1];
  fVar2 = (mtx->m_data).m_data[0].m_data[2];
  fVar3 = (mtx->m_data).m_data[0].m_data[3];
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = (mtx->m_data).m_data[0].m_data[0] * scalar;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = fVar1 * scalar;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = fVar2 * scalar;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = fVar3 * scalar;
  fVar1 = (mtx->m_data).m_data[1].m_data[1];
  fVar2 = (mtx->m_data).m_data[1].m_data[2];
  fVar3 = (mtx->m_data).m_data[1].m_data[3];
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = (mtx->m_data).m_data[1].m_data[0] * scalar;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = fVar1 * scalar;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = fVar2 * scalar;
  (__return_storage_ptr__->m_data).m_data[1].m_data[3] = fVar3 * scalar;
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}